

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O3

string * __thiscall
flatbuffers::(anonymous_namespace)::GenerateTypeString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BinaryRegion *region)

{
  size_type *psVar1;
  ulong __val;
  bool bVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  char cVar6;
  undefined1 *puVar7;
  long *plVar8;
  undefined8 *puVar9;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar10;
  string *extraout_RAX_01;
  ulong uVar11;
  long *plVar12;
  char cVar13;
  pointer pcVar14;
  _Alloc_hider _Var15;
  undefined8 *local_a0;
  long local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined1 local_87 [7];
  string *local_80;
  long local_78;
  string local_70;
  long local_50;
  long lStack_48;
  string *local_40;
  uint local_38;
  _Alloc_hider local_30;
  
  uVar4 = local_90._4_4_;
  uVar5 = local_90._7_1_;
  switch(*(undefined4 *)(this + 0x10)) {
  case 0:
    local_90 = (pointer)0x745f38746e69753f;
    break;
  case 1:
    local_90 = (pointer)0x3374657366664f55;
    goto LAB_003197ee;
  case 2:
    local_90 = (pointer)0x3374657366664f53;
LAB_003197ee:
    local_88 = 0x32;
    goto LAB_0031982d;
  case 3:
    local_90 = (pointer)0x3174657366664f56;
    local_88 = 0x36;
    goto LAB_0031982d;
  case 4:
    local_90 = (pointer)CONCAT44(uVar4,0x6c6f6f62);
    goto LAB_00319875;
  case 5:
  case 8:
    local_90 = (pointer)CONCAT26(local_90._6_2_,0x745f00000000);
    local_90 = (pointer)CONCAT44(local_90._4_4_,0x38746e69);
    goto LAB_003197a9;
  case 6:
    local_90 = (pointer)CONCAT44(uVar4,0x72616863);
    goto LAB_00319875;
  case 7:
    local_90 = (pointer)CONCAT17(uVar5,0x745f3874000000);
    local_90 = (pointer)CONCAT44(local_90._4_4_,0x746e6975);
    goto LAB_00319862;
  case 9:
    local_90 = (pointer)0x745f3631746e6975;
    break;
  case 10:
    local_90 = (pointer)CONCAT17(uVar5,0x745f3631000000);
    local_90 = (pointer)CONCAT44(local_90._4_4_,0x31746e69);
    goto LAB_00319862;
  case 0xb:
    local_90 = (pointer)0x745f3233746e6975;
    break;
  case 0xc:
    local_90 = (pointer)CONCAT17(uVar5,0x745f3233000000);
    local_90 = (pointer)CONCAT44(local_90._4_4_,0x33746e69);
    goto LAB_00319862;
  case 0xd:
    local_90 = (pointer)0x745f3436746e6975;
    break;
  case 0xe:
    local_90 = (pointer)CONCAT17(uVar5,0x745f3436000000);
    local_90 = (pointer)CONCAT44(local_90._4_4_,0x36746e69);
LAB_00319862:
    puVar7 = (undefined1 *)((long)&local_90 + 7);
    local_98 = 7;
    goto LAB_0031987a;
  case 0xf:
    puVar7 = (undefined1 *)((long)&local_90 + 5);
    local_90 = (pointer)CONCAT35(local_90._5_3_,0x7400000000);
    local_90 = (pointer)CONCAT44(local_90._4_4_,0x616f6c66);
    local_98 = 5;
    goto LAB_0031987a;
  case 0x10:
    local_90 = (pointer)CONCAT26(local_90._6_2_,0x656c00000000);
    local_90 = (pointer)CONCAT44(local_90._4_4_,0x62756f64);
    goto LAB_003197a9;
  case 0x11:
    local_90 = (pointer)CONCAT26(local_90._6_2_,0x386500000000);
    local_90 = (pointer)CONCAT44(local_90._4_4_,0x70795455);
LAB_003197a9:
    puVar7 = (undefined1 *)((long)&local_90 + 6);
    local_98 = 6;
    goto LAB_0031987a;
  case 0x12:
    local_90 = (pointer)0x3674657366664f55;
    local_88 = 0x34;
LAB_0031982d:
    puVar7 = local_87;
    local_98 = 9;
    goto LAB_0031987a;
  default:
    local_90 = (pointer)CONCAT44(uVar4,0x6f646f74);
LAB_00319875:
    puVar7 = (undefined1 *)((long)&local_90 + 4);
    local_98 = 4;
    goto LAB_0031987a;
  }
  puVar7 = &local_88;
  local_98 = 8;
LAB_0031987a:
  *puVar7 = 0;
  __val = *(ulong *)(this + 0x18);
  local_a0 = &local_90;
  if (__val == 0) {
    local_80 = &local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  }
  else {
    cVar13 = '\x01';
    if (9 < __val) {
      uVar11 = __val;
      cVar6 = '\x04';
      do {
        cVar13 = cVar6;
        if (uVar11 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_00319907;
        }
        if (uVar11 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_00319907;
        }
        if (uVar11 < 10000) goto LAB_00319907;
        bVar2 = 99999 < uVar11;
        uVar11 = uVar11 / 10000;
        cVar6 = cVar13 + '\x04';
      } while (bVar2);
      cVar13 = cVar13 + '\x01';
    }
LAB_00319907:
    local_40 = (string *)&local_30;
    std::__cxx11::string::_M_construct((ulong)&local_40,cVar13);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_40,local_38,__val);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x379344);
    local_70.field_2._M_allocated_capacity = (size_type)&local_50;
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_50 = *plVar12;
      lStack_48 = plVar8[3];
    }
    else {
      local_50 = *plVar12;
      local_70.field_2._M_allocated_capacity = (size_type)(long *)*plVar8;
    }
    local_70.field_2._8_8_ = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append(local_70.field_2._M_local_buf);
    local_80 = &local_70;
    psVar10 = (string *)(plVar8 + 2);
    if ((string *)*plVar8 == psVar10) {
      local_70._M_dataplus._M_p = (psVar10->_M_dataplus)._M_p;
      local_70._M_string_length = plVar8[3];
    }
    else {
      local_70._M_dataplus._M_p = (psVar10->_M_dataplus)._M_p;
      local_80 = (string *)*plVar8;
    }
    local_78 = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
  }
  pcVar14 = (pointer)0xf;
  if (local_a0 != &local_90) {
    pcVar14 = local_90;
  }
  if (pcVar14 < (pointer)(local_78 + local_98)) {
    _Var15._M_p = (pointer)0xf;
    if (local_80 != &local_70) {
      _Var15._M_p = local_70._M_dataplus._M_p;
    }
    if ((pointer)(local_78 + local_98) <= _Var15._M_p) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_a0);
      goto LAB_00319a44;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80);
LAB_00319a44:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar9 + 2;
  if ((size_type *)*puVar9 == psVar1) {
    uVar3 = puVar9[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar9;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  psVar10 = &local_70;
  if (local_80 != psVar10) {
    operator_delete(local_80,(ulong)(local_70._M_dataplus._M_p + 1));
    psVar10 = extraout_RAX;
  }
  if (__val != 0) {
    if ((long *)local_70.field_2._M_allocated_capacity != &local_50) {
      operator_delete((void *)local_70.field_2._M_allocated_capacity,local_50 + 1);
    }
    psVar10 = (string *)&local_30;
    if (local_40 != psVar10) {
      operator_delete(local_40,(ulong)(local_30._M_p + 1));
      psVar10 = extraout_RAX_00;
    }
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,(ulong)(local_90 + 1));
    psVar10 = extraout_RAX_01;
  }
  return psVar10;
}

Assistant:

static std::string GenerateTypeString(const BinaryRegion &region) {
  return ToString(region.type) +
         ((region.array_length)
              ? "[" + std::to_string(region.array_length) + "]"
              : "");
}